

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void jpgd::DCT_Upsample::P_Q<7,_6>::calc(Matrix44 *P,Matrix44 *Q,jpgd_block_t *pSrc)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  
  sVar1 = pSrc[1];
  sVar2 = pSrc[3];
  sVar3 = pSrc[5];
  sVar4 = pSrc[9];
  sVar5 = pSrc[0xb];
  sVar6 = pSrc[0xd];
  sVar7 = pSrc[0x19];
  sVar8 = pSrc[0x1b];
  sVar9 = pSrc[0x1d];
  sVar10 = pSrc[0x21];
  sVar11 = pSrc[0x23];
  sVar12 = pSrc[0x25];
  sVar13 = pSrc[0x29];
  sVar14 = pSrc[0x2b];
  sVar15 = pSrc[0x2d];
  iVar33 = (int)pSrc[8];
  sVar16 = pSrc[0x10];
  iVar34 = (int)pSrc[0x18];
  sVar17 = pSrc[0x20];
  iVar35 = (int)pSrc[0x28];
  sVar18 = pSrc[0x30];
  sVar19 = pSrc[0x11];
  sVar20 = pSrc[0x13];
  sVar21 = pSrc[0x15];
  sVar22 = pSrc[0x31];
  sVar23 = pSrc[0x33];
  sVar24 = pSrc[0x35];
  sVar25 = pSrc[4];
  iVar29 = (int)pSrc[0xc];
  sVar26 = pSrc[0x14];
  iVar30 = (int)pSrc[0x1c];
  sVar27 = pSrc[0x24];
  iVar31 = (int)pSrc[0x2c];
  sVar28 = pSrc[0x34];
  P->v[0][0] = (int)*pSrc;
  P->v[0][1] = iVar35 * -0x168 + 0x200 + iVar34 * 0x32a + iVar33 * 0x1aa >> 10;
  P->v[0][2] = (int)sVar17;
  P->v[0][3] = iVar35 * 0x1f6 + 0x200 + iVar34 * -99 + iVar33 * 0x17 >> 10;
  P->v[1][0] = sVar3 * -0x168 + 0x200 + sVar2 * 0x32a + sVar1 * 0x1aa >> 10;
  iVar40 = sVar6 * -0x168 + 0x200 + sVar5 * 0x32a + sVar4 * 0x1aa >> 10;
  iVar37 = sVar9 * -0x168 + 0x200 + sVar8 * 0x32a + sVar7 * 0x1aa >> 10;
  iVar38 = sVar15 * -0x168 + 0x200 + sVar14 * 0x32a + sVar13 * 0x1aa >> 10;
  P->v[1][1] = iVar38 * -0x168 + 0x200 + iVar37 * 0x32a + iVar40 * 0x1aa >> 10;
  P->v[1][2] = sVar12 * -0x168 + 0x200 + sVar11 * 0x32a + sVar10 * 0x1aa >> 10;
  P->v[1][3] = iVar38 * 0x1f6 + 0x200 + iVar37 * -99 + iVar40 * 0x17 >> 10;
  P->v[2][0] = (int)sVar25;
  P->v[2][1] = iVar31 * -0x168 + 0x200 + iVar30 * 0x32a + iVar29 * 0x1aa >> 10;
  P->v[2][2] = (int)sVar27;
  P->v[2][3] = iVar31 * 0x1f6 + 0x200 + iVar30 * -99 + iVar29 * 0x17 >> 10;
  P->v[3][0] = sVar3 * 0x1f6 + 0x200 + sVar2 * -99 + sVar1 * 0x17 >> 10;
  iVar36 = sVar6 * 0x1f6 + 0x200 + sVar5 * -99 + sVar4 * 0x17 >> 10;
  iVar39 = sVar9 * 0x1f6 + 0x200 + sVar8 * -99 + sVar7 * 0x17 >> 10;
  iVar32 = sVar15 * 0x1f6 + 0x200 + sVar14 * -99 + sVar13 * 0x17 >> 10;
  P->v[3][1] = iVar32 * -0x168 + 0x200 + iVar39 * 0x32a + iVar36 * 0x1aa >> 10;
  P->v[3][2] = sVar12 * 0x1f6 + 0x200 + sVar11 * -99 + sVar10 * 0x17 >> 10;
  P->v[3][3] = iVar32 * 0x1f6 + 0x200 + iVar39 * -99 + iVar36 * 0x17 >> 10;
  Q->v[0][0] = iVar35 * 0xda + 0x200 + iVar34 * -0x145 + iVar33 * 0x3a0 >> 10;
  Q->v[0][1] = (int)sVar16;
  Q->v[0][2] = iVar35 * 0x313 + 0x200 + iVar34 * 0x20e + iVar33 * -0x4b >> 10;
  Q->v[0][3] = (int)sVar18;
  Q->v[1][0] = iVar38 * 0xda + 0x200 + iVar37 * -0x145 + iVar40 * 0x3a0 >> 10;
  Q->v[1][1] = sVar21 * -0x168 + 0x200 + sVar20 * 0x32a + sVar19 * 0x1aa >> 10;
  Q->v[1][2] = iVar38 * 0x313 + 0x200 + iVar37 * 0x20e + iVar40 * -0x4b >> 10;
  Q->v[1][3] = sVar24 * -0x168 + 0x200 + sVar23 * 0x32a + sVar22 * 0x1aa >> 10;
  Q->v[2][0] = iVar31 * 0xda + 0x200 + iVar30 * -0x145 + iVar29 * 0x3a0 >> 10;
  Q->v[2][1] = (int)sVar26;
  Q->v[2][2] = iVar31 * 0x313 + 0x200 + iVar30 * 0x20e + iVar29 * -0x4b >> 10;
  Q->v[2][3] = (int)sVar28;
  Q->v[3][0] = iVar32 * 0xda + 0x200 + iVar39 * -0x145 + iVar36 * 0x3a0 >> 10;
  Q->v[3][1] = sVar21 * 0x1f6 + 0x200 + sVar20 * -99 + sVar19 * 0x17 >> 10;
  Q->v[3][2] = iVar32 * 0x313 + 0x200 + iVar39 * 0x20e + iVar36 * -0x4b >> 10;
  Q->v[3][3] = sVar24 * 0x1f6 + 0x200 + sVar23 * -99 + sVar22 * 0x17 >> 10;
  return;
}

Assistant:

static void calc(Matrix44& P, Matrix44& Q, const jpgd_block_t* pSrc)
    {
      // 4x8 = 4x8 times 8x8, matrix 0 is constant
      const Temp_Type X000 = AT(0, 0);
      const Temp_Type X001 = AT(0, 1);
      const Temp_Type X002 = AT(0, 2);
      const Temp_Type X003 = AT(0, 3);
      const Temp_Type X004 = AT(0, 4);
      const Temp_Type X005 = AT(0, 5);
      const Temp_Type X006 = AT(0, 6);
      const Temp_Type X007 = AT(0, 7);
      const Temp_Type X010 = D(F(0.415735f) * AT(1, 0) + F(0.791065f) * AT(3, 0) + F(-0.352443f) * AT(5, 0) + F(0.277785f) * AT(7, 0));
      const Temp_Type X011 = D(F(0.415735f) * AT(1, 1) + F(0.791065f) * AT(3, 1) + F(-0.352443f) * AT(5, 1) + F(0.277785f) * AT(7, 1));
      const Temp_Type X012 = D(F(0.415735f) * AT(1, 2) + F(0.791065f) * AT(3, 2) + F(-0.352443f) * AT(5, 2) + F(0.277785f) * AT(7, 2));
      const Temp_Type X013 = D(F(0.415735f) * AT(1, 3) + F(0.791065f) * AT(3, 3) + F(-0.352443f) * AT(5, 3) + F(0.277785f) * AT(7, 3));
      const Temp_Type X014 = D(F(0.415735f) * AT(1, 4) + F(0.791065f) * AT(3, 4) + F(-0.352443f) * AT(5, 4) + F(0.277785f) * AT(7, 4));
      const Temp_Type X015 = D(F(0.415735f) * AT(1, 5) + F(0.791065f) * AT(3, 5) + F(-0.352443f) * AT(5, 5) + F(0.277785f) * AT(7, 5));
      const Temp_Type X016 = D(F(0.415735f) * AT(1, 6) + F(0.791065f) * AT(3, 6) + F(-0.352443f) * AT(5, 6) + F(0.277785f) * AT(7, 6));
      const Temp_Type X017 = D(F(0.415735f) * AT(1, 7) + F(0.791065f) * AT(3, 7) + F(-0.352443f) * AT(5, 7) + F(0.277785f) * AT(7, 7));
      const Temp_Type X020 = AT(4, 0);
      const Temp_Type X021 = AT(4, 1);
      const Temp_Type X022 = AT(4, 2);
      const Temp_Type X023 = AT(4, 3);
      const Temp_Type X024 = AT(4, 4);
      const Temp_Type X025 = AT(4, 5);
      const Temp_Type X026 = AT(4, 6);
      const Temp_Type X027 = AT(4, 7);
      const Temp_Type X030 = D(F(0.022887f) * AT(1, 0) + F(-0.097545f) * AT(3, 0) + F(0.490393f) * AT(5, 0) + F(0.865723f) * AT(7, 0));
      const Temp_Type X031 = D(F(0.022887f) * AT(1, 1) + F(-0.097545f) * AT(3, 1) + F(0.490393f) * AT(5, 1) + F(0.865723f) * AT(7, 1));
      const Temp_Type X032 = D(F(0.022887f) * AT(1, 2) + F(-0.097545f) * AT(3, 2) + F(0.490393f) * AT(5, 2) + F(0.865723f) * AT(7, 2));
      const Temp_Type X033 = D(F(0.022887f) * AT(1, 3) + F(-0.097545f) * AT(3, 3) + F(0.490393f) * AT(5, 3) + F(0.865723f) * AT(7, 3));
      const Temp_Type X034 = D(F(0.022887f) * AT(1, 4) + F(-0.097545f) * AT(3, 4) + F(0.490393f) * AT(5, 4) + F(0.865723f) * AT(7, 4));
      const Temp_Type X035 = D(F(0.022887f) * AT(1, 5) + F(-0.097545f) * AT(3, 5) + F(0.490393f) * AT(5, 5) + F(0.865723f) * AT(7, 5));
      const Temp_Type X036 = D(F(0.022887f) * AT(1, 6) + F(-0.097545f) * AT(3, 6) + F(0.490393f) * AT(5, 6) + F(0.865723f) * AT(7, 6));
      const Temp_Type X037 = D(F(0.022887f) * AT(1, 7) + F(-0.097545f) * AT(3, 7) + F(0.490393f) * AT(5, 7) + F(0.865723f) * AT(7, 7));

      // 4x4 = 4x8 times 8x4, matrix 1 is constant
      P.at(0, 0) = X000;
      P.at(0, 1) = D(X001 * F(0.415735f) + X003 * F(0.791065f) + X005 * F(-0.352443f) + X007 * F(0.277785f));
      P.at(0, 2) = X004;
      P.at(0, 3) = D(X001 * F(0.022887f) + X003 * F(-0.097545f) + X005 * F(0.490393f) + X007 * F(0.865723f));
      P.at(1, 0) = X010;
      P.at(1, 1) = D(X011 * F(0.415735f) + X013 * F(0.791065f) + X015 * F(-0.352443f) + X017 * F(0.277785f));
      P.at(1, 2) = X014;
      P.at(1, 3) = D(X011 * F(0.022887f) + X013 * F(-0.097545f) + X015 * F(0.490393f) + X017 * F(0.865723f));
      P.at(2, 0) = X020;
      P.at(2, 1) = D(X021 * F(0.415735f) + X023 * F(0.791065f) + X025 * F(-0.352443f) + X027 * F(0.277785f));
      P.at(2, 2) = X024;
      P.at(2, 3) = D(X021 * F(0.022887f) + X023 * F(-0.097545f) + X025 * F(0.490393f) + X027 * F(0.865723f));
      P.at(3, 0) = X030;
      P.at(3, 1) = D(X031 * F(0.415735f) + X033 * F(0.791065f) + X035 * F(-0.352443f) + X037 * F(0.277785f));
      P.at(3, 2) = X034;
      P.at(3, 3) = D(X031 * F(0.022887f) + X033 * F(-0.097545f) + X035 * F(0.490393f) + X037 * F(0.865723f));
      // 40 muls 24 adds

      // 4x4 = 4x8 times 8x4, matrix 1 is constant
      Q.at(0, 0) = D(X001 * F(0.906127f) + X003 * F(-0.318190f) + X005 * F(0.212608f) + X007 * F(-0.180240f));
      Q.at(0, 1) = X002;
      Q.at(0, 2) = D(X001 * F(-0.074658f) + X003 * F(0.513280f) + X005 * F(0.768178f) + X007 * F(-0.375330f));
      Q.at(0, 3) = X006;
      Q.at(1, 0) = D(X011 * F(0.906127f) + X013 * F(-0.318190f) + X015 * F(0.212608f) + X017 * F(-0.180240f));
      Q.at(1, 1) = X012;
      Q.at(1, 2) = D(X011 * F(-0.074658f) + X013 * F(0.513280f) + X015 * F(0.768178f) + X017 * F(-0.375330f));
      Q.at(1, 3) = X016;
      Q.at(2, 0) = D(X021 * F(0.906127f) + X023 * F(-0.318190f) + X025 * F(0.212608f) + X027 * F(-0.180240f));
      Q.at(2, 1) = X022;
      Q.at(2, 2) = D(X021 * F(-0.074658f) + X023 * F(0.513280f) + X025 * F(0.768178f) + X027 * F(-0.375330f));
      Q.at(2, 3) = X026;
      Q.at(3, 0) = D(X031 * F(0.906127f) + X033 * F(-0.318190f) + X035 * F(0.212608f) + X037 * F(-0.180240f));
      Q.at(3, 1) = X032;
      Q.at(3, 2) = D(X031 * F(-0.074658f) + X033 * F(0.513280f) + X035 * F(0.768178f) + X037 * F(-0.375330f));
      Q.at(3, 3) = X036;
      // 40 muls 24 adds
    }